

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalLut.c
# Opt level: O2

int Bal_ManSetGateLevel(Bal_Man_t *p,Gia_Obj_t *pObjOld,int iLitNew)

{
  uint Lit;
  undefined8 uVar1;
  uint *puVar2;
  uint v;
  int iVar3;
  int i;
  int iVar4;
  int iVar5;
  int iVar6;
  Gia_Obj_t *pObj;
  int i_00;
  int in_R8D;
  int in_R9D;
  int Target;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffffa8;
  int local_38;
  
  v = Abc_Lit2Var(iLitNew);
  pObj = Gia_ManObj(p->pNew,v);
  iVar3 = Gia_ObjIsMux(p->pNew,pObj);
  if ((int)v < p->vCutSets->nSize) {
    iVar3 = -1;
  }
  else {
    uVar1 = *(undefined8 *)pObj;
    if (iVar3 == 0) {
      local_38 = 0;
    }
    else {
      puVar2 = p->pNew->pMuxes;
      local_38 = -1;
      if ((puVar2 != (uint *)0x0) && (Lit = puVar2[v], Lit != 0)) {
        local_38 = Abc_Lit2Var(Lit);
      }
    }
    i = v - ((uint)uVar1 & 0x1fffffff);
    i_00 = v - ((uint)((ulong)uVar1 >> 0x20) & 0x1fffffff);
    if (iVar3 != 0) {
      Gia_ObjFaninC2(p->pNew,pObj);
    }
    iVar4 = Bal_ObjDelay(p,i);
    iVar5 = Bal_ObjDelay(p,i_00);
    iVar6 = Bal_ObjDelay(p,local_38);
    iVar3 = iVar6;
    if (iVar6 < iVar5) {
      iVar3 = iVar5;
    }
    Target = iVar3;
    if (iVar3 < iVar4) {
      Target = iVar4;
    }
    if ((0 < Target) &&
       (iVar3 = Bal_ManDeriveCuts(p,i,i_00,local_38,in_R8D,in_R9D,in_stack_ffffffffffffff88,
                                  (uint)(iVar4 < iVar3),(uint)(iVar5 != Target),
                                  (uint)(iVar6 != Target),in_stack_ffffffffffffffa8,Target,1),
       -1 < iVar3)) {
      return iVar3;
    }
    iVar3 = Bal_ManDeriveCuts(p,i,i_00,local_38,in_R8D,in_R9D,in_stack_ffffffffffffff88,1,1,1,
                              in_stack_ffffffffffffffa8,Target + 1,1);
    if (iVar3 < 0) {
      __assert_fail("Cost >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaBalLut.c"
                    ,0x20b,"int Bal_ManSetGateLevel(Bal_Man_t *, Gia_Obj_t *, int)");
    }
  }
  return iVar3;
}

Assistant:

int Bal_ManSetGateLevel( Bal_Man_t * p, Gia_Obj_t * pObjOld, int iLitNew )
{
    int iFan0, iFan1, iFan2, Cost;
    int fCompl0, fCompl1, fCompl2;
    int fUnit0, fUnit1, fUnit2;
    int Delay0, Delay1, Delay2, DelayMax;
    int iObjNew = Abc_Lit2Var(iLitNew);
    Gia_Obj_t * pObjNew = Gia_ManObj( p->pNew, iObjNew );
    int fMux = Gia_ObjIsMux(p->pNew, pObjNew);
    if ( iObjNew < Vec_PtrSize(p->vCutSets) )
        return -1;
    iFan0    = Gia_ObjFaninId0( pObjNew, iObjNew );
    iFan1    = Gia_ObjFaninId1( pObjNew, iObjNew );
    iFan2    = fMux ? Gia_ObjFaninId2(p->pNew, iObjNew) : 0;
    fCompl0  = Gia_ObjFaninC0( pObjNew );
    fCompl1  = Gia_ObjFaninC1( pObjNew );
    fCompl2  = fMux ? Gia_ObjFaninC2(p->pNew, pObjNew) : 0;
    Delay0   = Bal_ObjDelay( p, iFan0 );
    Delay1   = Bal_ObjDelay( p, iFan1 );
    Delay2   = Bal_ObjDelay( p, iFan2 );
    DelayMax = Abc_MaxInt( Delay0, Abc_MaxInt(Delay1, Delay2) );
    fUnit0   = (int)(Delay0 != DelayMax); 
    fUnit1   = (int)(Delay1 != DelayMax); 
    fUnit2   = (int)(Delay2 != DelayMax); 
    if ( DelayMax > 0 )
    {
//printf( "A" );
        Cost = Bal_ManDeriveCuts(p, iFan0, iFan1, iFan2, fCompl0, fCompl1, fCompl2, fUnit0, fUnit1, fUnit2, Gia_ObjIsXor(pObjNew), DelayMax, 1 );
//printf( "B" );
        if ( Cost >= 0 )
            return Cost;
    }
    DelayMax++;
    fUnit0 = fUnit1 = fUnit2 = 1;
//printf( "A" );
    Cost = Bal_ManDeriveCuts(p, iFan0, iFan1, iFan2, fCompl0, fCompl1, fCompl2, fUnit0, fUnit1, fUnit2, Gia_ObjIsXor(pObjNew), DelayMax, 1 );
//printf( "B" );
    assert( Cost >= 0 );
    return Cost;
}